

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::parseInterpolationFragment(Lexer *this,bool start)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char cVar4;
  Token TVar5;
  
  (this->stringValue_)._M_string_length = 0;
  cVar4 = (char)this + -0x58;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  nextChar(this,true);
  iVar3 = -1;
  do {
    bVar2 = eof(this);
    TVar5 = Eof;
    if (bVar2) {
LAB_0012e040:
      this->token_ = TVar5;
      return TVar5;
    }
    iVar1 = this->currentChar_;
    if (iVar3 != 0x5c && iVar1 == 0x22) {
      nextChar(this,true);
      this->interpolationDepth_ = this->interpolationDepth_ + -1;
      TVar5 = InterpolatedStringEnd;
      if (start) {
        TVar5 = String;
      }
      goto LAB_0012e040;
    }
    if (iVar1 == 0x23) {
      nextChar(this,true);
      if (this->currentChar_ == 0x7b) {
        nextChar(this,true);
        TVar5 = InterpolatedStringFragment;
        goto LAB_0012e040;
      }
LAB_0012dfd4:
      std::__cxx11::string::push_back(cVar4);
    }
    else if (iVar1 == 0x5c) {
      nextChar(this,true);
      bVar2 = eof(this);
      if (bVar2) goto LAB_0012e040;
      iVar3 = this->currentChar_;
      if ((((iVar3 != 0x5c) && (iVar3 != 0x74)) && (iVar3 != 0x72)) && (iVar3 != 0x6e))
      goto LAB_0012dfd4;
    }
    std::__cxx11::string::push_back(cVar4);
    iVar3 = this->currentChar_;
    nextChar(this,true);
  } while( true );
}

Assistant:

Token Lexer::parseInterpolationFragment(bool start) {
  int last = -1;
  stringValue_.clear();

  // skip either '"' or '}' depending on your we entered
  nextChar();

  for (;;) {
    if (eof()) return token_ = Token::Eof;

    if (currentChar() == '"' && last != '\\') {
      nextChar();
      --interpolationDepth_;
      return token_ =
                 start ? Token::String : Token::InterpolatedStringEnd;
    }

    if (currentChar() == '\\') {
      nextChar();

      if (eof()) return token_ = Token::Eof;

      switch (currentChar()) {
        case 'r':
          stringValue_ += '\r';
          break;
        case 'n':
          stringValue_ += '\n';
          break;
        case 't':
          stringValue_ += '\t';
          break;
        case '\\':
          stringValue_ += '\\';
          break;
        default:
          stringValue_ += '\\';
          stringValue_ += static_cast<char>(currentChar());
          break;
      }
    } else if (currentChar() == '#') {
      nextChar();
      if (currentChar() == '{') {
        nextChar();
        return token_ = Token::InterpolatedStringFragment;
      } else {
        stringValue_ += '#';
      }
      stringValue_ += static_cast<char>(currentChar());
    } else {
      stringValue_ += static_cast<char>(currentChar());
    }

    last = currentChar();
    nextChar();
  }
}